

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O0

void string_hash_test(void)

{
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  int j;
  int i;
  char str [32];
  uint b;
  uint a;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  int local_80;
  uint local_7c;
  uint8_t local_78 [32];
  uint32_t local_58;
  uint32_t local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (local_7c = 0; (int)local_7c < 0x10; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < 8; local_80 = local_80 + 1) {
      iVar1 = rand();
      local_78[local_80] = (char)(iVar1 % 0x19) + 'a';
    }
    local_78[local_80] = '\0';
    sVar3 = strlen((char *)local_78);
    local_58 = hash_djb2(local_78,(int)sVar3);
    printf("%s %10u %5u\n",local_78,(ulong)local_58,(ulong)(local_58 & 0xfff));
  }
  for (local_7c = 0; (int)local_7c < 0x10; local_7c = local_7c + 1) {
    iVar1 = rand();
    sprintf((char *)local_78,"asdf%d.%d",(ulong)local_7c,(long)iVar1 % 100 & 0xffffffff);
    sVar3 = strlen((char *)local_78);
    local_58 = hash_djb2(local_78,(int)sVar3);
    printf("%s %10u %5u\n",local_78,(ulong)local_58,(ulong)(local_58 & 0x3ff));
  }
  sprintf((char *)local_78,"1234aaaaaaaa");
  sVar3 = strlen((char *)local_78);
  local_54 = hash_djb2(local_78,(int)sVar3);
  sprintf((char *)local_78,"5678aaaaaaaa");
  sVar3 = strlen((char *)local_78);
  local_58 = hash_djb2(local_78,(int)sVar3);
  printf("%u %u\n",(ulong)local_54,(ulong)local_58);
  sprintf((char *)local_78,"1234aaaaaaaa");
  sVar3 = strlen((char *)local_78);
  local_54 = hash_djb2_last8(local_78,(int)sVar3);
  sprintf((char *)local_78,"5678aaaaaaaa");
  sVar3 = strlen((char *)local_78);
  local_58 = hash_djb2_last8(local_78,(int)sVar3);
  printf("%u %u\n",(ulong)local_54,(ulong)local_58);
  sprintf((char *)local_78,"./dummy0");
  sVar3 = strlen((char *)local_78);
  local_54 = hash_djb2_last8(local_78,(int)sVar3);
  sprintf((char *)local_78,"./dummy01");
  sVar3 = strlen((char *)local_78);
  local_58 = hash_djb2_last8(local_78,(int)sVar3);
  printf("%u %u\n",(ulong)local_54,(ulong)local_58);
  if (string_hash_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","string hash test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","string hash test");
  }
  return;
}

Assistant:

void string_hash_test()
{
    TEST_INIT();

    randomize();
    unsigned a, b;
    char str[32];

    int i,j;

    for (i=0;i<16;++i){
        for (j=0;j<8;++j){
            str[j] = 'a' + random('z'-'a');
        }
        str[j] = 0;
        b = hash_djb2((uint8_t *)str, strlen(str));
        (void)b;
        DBG("%s %10u %5u\n",str, b, b&0xfff);
    }

    for (i=0;i<16;++i){
        sprintf(str, "asdf%d.%d",i,random(100));
        b = hash_djb2((uint8_t *)str, strlen(str));
        (void)b;
        DBG("%s %10u %5u\n",str, b, b&((unsigned)1023));
    }

    sprintf(str, "1234aaaaaaaa");
    a = hash_djb2((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "5678aaaaaaaa");
    b = hash_djb2((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    sprintf(str, "1234aaaaaaaa");
    a = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "5678aaaaaaaa");
    b = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    sprintf(str, "./dummy0");
    a = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "./dummy01");
    b = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    TEST_RESULT("string hash test");
}